

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::GetSource(cmMakefile *this,string *sourceName,cmSourceFileLocationKind kind)

{
  bool bVar1;
  pointer pvVar2;
  cmake *this_00;
  string *file;
  pointer pvVar3;
  reference ppcVar4;
  cmSourceFile *sf;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_true>
  local_c0;
  const_iterator sfsi;
  undefined1 local_a8 [8];
  string name;
  cmSourceFileLocation sfl;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_true>
  local_30;
  const_iterator sfsi_1;
  cmSourceFileLocationKind kind_local;
  string *sourceName_local;
  cmMakefile *this_local;
  
  sfsi_1.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_true>
  ._M_cur._4_4_ = kind;
  if (kind == Known) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
         ::find(&this->KnownFileSearchIndex,sourceName);
    sfl.Name.field_2._8_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
         ::end(&this->KnownFileSearchIndex);
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_true>
                        *)((long)&sfl.Name.field_2 + 8));
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_false,_true>
                             *)&local_30);
      return pvVar2->second;
    }
  }
  cmSourceFileLocation::cmSourceFileLocation
            ((cmSourceFileLocation *)((long)&name.field_2 + 8),this,sourceName,
             sfsi_1.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_true>
             ._M_cur._4_4_);
  this_00 = GetCMakeInstance(this);
  file = cmSourceFileLocation::GetName_abi_cxx11_((cmSourceFileLocation *)((long)&name.field_2 + 8))
  ;
  cmake::StripExtension((string *)local_a8,this_00,file);
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
       ::find(&this->SourceFileSearchIndex,(key_type *)local_a8);
  __range2 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::end(&this->SourceFileSearchIndex);
  bVar1 = std::__detail::operator!=
                    (&local_c0,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_true>
                      *)&__range2);
  if (bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_false,_true>
                           *)&local_c0);
    __end2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(&pvVar3->second);
    sf = (cmSourceFile *)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(&pvVar3->second);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                       *)&sf), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&__end2);
      this_local = (cmMakefile *)*ppcVar4;
      bVar1 = cmSourceFile::Matches
                        ((cmSourceFile *)this_local,
                         (cmSourceFileLocation *)((long)&name.field_2 + 8));
      if (bVar1) goto LAB_00201b9a;
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
  }
  this_local = (cmMakefile *)0x0;
LAB_00201b9a:
  std::__cxx11::string::~string((string *)local_a8);
  cmSourceFileLocation::~cmSourceFileLocation((cmSourceFileLocation *)((long)&name.field_2 + 8));
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmMakefile::GetSource(const std::string& sourceName,
                                    cmSourceFileLocationKind kind) const
{
  // First check "Known" paths (avoids the creation of cmSourceFileLocation)
  if (kind == cmSourceFileLocationKind::Known) {
    auto sfsi = this->KnownFileSearchIndex.find(sourceName);
    if (sfsi != this->KnownFileSearchIndex.end()) {
      return sfsi->second;
    }
  }

  cmSourceFileLocation sfl(this, sourceName, kind);
  auto name = this->GetCMakeInstance()->StripExtension(sfl.GetName());
#if defined(_WIN32) || defined(__APPLE__)
  name = cmSystemTools::LowerCase(name);
#endif
  auto sfsi = this->SourceFileSearchIndex.find(name);
  if (sfsi != this->SourceFileSearchIndex.end()) {
    for (auto* sf : sfsi->second) {
      if (sf->Matches(sfl)) {
        return sf;
      }
    }
  }
  return nullptr;
}